

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int nextc(RN *rn)

{
  int iVar1;
  long lVar2;
  
  iVar1 = rn->n;
  lVar2 = (long)iVar1;
  if (199 < lVar2) {
    rn->buff[0] = '\0';
  }
  else {
    rn->n = iVar1 + 1;
    rn->buff[lVar2] = (char)rn->c;
    iVar1 = getc_unlocked((FILE *)rn->f);
    rn->c = iVar1;
  }
  return (uint)(199 >= lVar2);
}

Assistant:

static int nextc (RN *rn) {
  if (l_unlikely(rn->n >= L_MAXLENNUM)) {  /* buffer overflow? */
    rn->buff[0] = '\0';  /* invalidate result */
    return 0;  /* fail */
  }
  else {
    rn->buff[rn->n++] = rn->c;  /* save current char */
    rn->c = l_getc(rn->f);  /* read next one */
    return 1;
  }
}